

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

size_t printDisp32(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm,long MyNumber)

{
  long lVar1;
  size_t sVar2;
  size_t j;
  long MyNumber_local;
  PDISASM pMyDisasm_local;
  size_t i_local;
  OPTYPE *pMyOperand_local;
  
  j = MyNumber;
  if ((((pMyDisasm->Reserved_).RM_ == 4) && ((pMyDisasm->Reserved_).BASE_ == 4)) &&
     (0x1f < (pMyDisasm->Reserved_).Architecture)) {
    lVar1 = specificPop(pMyDisasm);
    j = lVar1 + MyNumber;
  }
  if ((long)j < 0) {
    strcpy(pMyOperand->OpMnemonic + i,"-");
    sVar2 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i + 1,"%.8X",
                                (j ^ 0xffffffffffffffff) + 1);
    pMyDisasm_local = (PDISASM)(sVar2 + i + 1);
  }
  else {
    strcpy(pMyOperand->OpMnemonic + i,"+");
    sVar2 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i + 1,"%.8X",j);
    pMyDisasm_local = (PDISASM)(sVar2 + i + 1);
  }
  return (size_t)pMyDisasm_local;
}

Assistant:

size_t __bea_callspec__ printDisp32(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm, long MyNumber)
{
  size_t j;

  if ((GV.RM_ == 4) && (GV.BASE_ == 4) && (GV.Architecture >=32)) {
    MyNumber += specificPop(pMyDisasm);
  }

  if (MyNumber < 0) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "-");
      #endif
      i ++;
      j=i;
      #ifndef BEA_LIGHT_DISASSEMBLY
         i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) ~MyNumber+1);
      #endif
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i ++;
      j = i;
      #ifndef BEA_LIGHT_DISASSEMBLY
         i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) MyNumber);
      #endif
  }

  return i;
}